

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O3

void __thiscall
cfg::tag_vector_t<cfgfile::string_trait_t>::tag_vector_t
          (tag_vector_t<cfgfile::string_trait_t> *this)

{
  child_tags_list_t *pcVar1;
  vector_of_tags_t *pvVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *local_60;
  long local_58;
  long local_50 [2];
  string_t local_40;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"vector","");
  paVar3 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_58 + (long)local_60);
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_0013f718;
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.m_name.
  _M_dataplus._M_p =
       (pointer)&(this->super_tag_no_value_t<cfgfile::string_trait_t>).
                 super_tag_t<cfgfile::string_trait_t>.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->super_tag_no_value_t<cfgfile::string_trait_t>).
              super_tag_t<cfgfile::string_trait_t>.m_name,local_40._M_dataplus._M_p,
             local_40._M_dataplus._M_p + local_40._M_string_length);
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_mandatory = true;
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_defined = false;
  pcVar1 = &(this->super_tag_no_value_t<cfgfile::string_trait_t>).
            super_tag_t<cfgfile::string_trait_t>.m_child_tags;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_child_tags.
    super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)
   &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_line_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_no_value_t<cfgfile::string_trait_t>).
           super_tag_t<cfgfile::string_trait_t>.m_line_number + 4) = 0xffffffff;
  *(undefined4 *)
   &(this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
    m_column_number = 0xffffffff;
  *(undefined4 *)
   ((long)&(this->super_tag_no_value_t<cfgfile::string_trait_t>).
           super_tag_t<cfgfile::string_trait_t>.m_column_number + 4) = 0xffffffff;
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_t_0013f6d0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_vector_t_0013f648;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"vector","");
  local_40._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_58 + (long)local_60);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&(this->m_vector).super_tag_t<cfgfile::string_trait_t>,
             (tag_t<cfgfile::string_trait_t> *)this,&local_40,true);
  (this->m_vector).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t =
       (_func_int **)&PTR__tag_vector_of_tags_t_0013f760;
  pvVar2 = &(this->m_vector).m_tags;
  (pvVar2->
  super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_vector).m_tags.
    super__Vector_base<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>,_std::allocator<std::shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_vector).m_current.
  super___shared_ptr<cfg::tag_tags_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

tag_vector_t()
		:	cfgfile::tag_no_value_t< Trait >( Trait::from_ascii( "vector" ), true )
		,	m_vector( *this, Trait::from_ascii( "vector" ), true )
	{
	}